

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O3

void bn_mul_normal(unsigned_long *r,unsigned_long *a,int na,unsigned_long *b,int nb)

{
  unsigned_long *puVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  puVar1 = b;
  uVar5 = nb;
  if (na < nb) {
    puVar1 = a;
    a = b;
    uVar5 = na;
    na = nb;
  }
  if ((int)uVar5 < 1) {
    bn_mul_words(r,a,na,0);
    return;
  }
  lVar4 = (long)na;
  uVar2 = bn_mul_words(r,a,na,*puVar1);
  r[lVar4] = uVar2;
  if (uVar5 != 1) {
    lVar3 = 0;
    do {
      uVar2 = bn_mul_add_words((ulong *)((long)r + lVar3 + 8),a,na,
                               *(ulong *)((long)puVar1 + lVar3 + 8));
      *(ulong *)((long)r + lVar3 + lVar4 * 8 + 8) = uVar2;
      if (uVar5 == 2) {
        return;
      }
      uVar2 = bn_mul_add_words((ulong *)((long)r + lVar3 + 0x10),a,na,
                               *(ulong *)((long)puVar1 + lVar3 + 0x10));
      *(ulong *)((long)r + lVar3 + lVar4 * 8 + 0x10) = uVar2;
      uVar6 = uVar5 - 4;
      if (uVar5 < 4) {
        return;
      }
      uVar2 = bn_mul_add_words((ulong *)((long)r + lVar3 + 0x18),a,na,
                               *(ulong *)((long)puVar1 + lVar3 + 0x18));
      *(ulong *)((long)r + lVar3 + lVar4 * 8 + 0x18) = uVar2;
      if (uVar5 == 4) {
        return;
      }
      uVar2 = bn_mul_add_words((ulong *)((long)r + lVar3 + 0x20),a,na,
                               *(ulong *)((long)puVar1 + lVar3 + 0x20));
      *(ulong *)((long)r + lVar3 + lVar4 * 8 + 0x20) = uVar2;
      lVar3 = lVar3 + 0x20;
      uVar5 = uVar6;
    } while (1 < uVar6);
  }
  return;
}

Assistant:

void bn_mul_normal(BN_ULONG *r, BN_ULONG *a, int na, BN_ULONG *b, int nb)
{
    BN_ULONG *rr;

    if (na < nb) {
        int itmp;
        BN_ULONG *ltmp;

        itmp = na;
        na = nb;
        nb = itmp;
        ltmp = a;
        a = b;
        b = ltmp;

    }
    rr = &(r[na]);
    if (nb <= 0) {
        (void)bn_mul_words(r, a, na, 0);
        return;
    } else
        rr[0] = bn_mul_words(r, a, na, b[0]);

    for (;;) {
        if (--nb <= 0)
            return;
        rr[1] = bn_mul_add_words(&(r[1]), a, na, b[1]);
        if (--nb <= 0)
            return;
        rr[2] = bn_mul_add_words(&(r[2]), a, na, b[2]);
        if (--nb <= 0)
            return;
        rr[3] = bn_mul_add_words(&(r[3]), a, na, b[3]);
        if (--nb <= 0)
            return;
        rr[4] = bn_mul_add_words(&(r[4]), a, na, b[4]);
        rr += 4;
        r += 4;
        b += 4;
    }
}